

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.cpp
# Opt level: O0

index_type * cmrc::whence_prefix::(anonymous_namespace)::get_root_index_abi_cxx11_(void)

{
  directory *pdVar1;
  int iVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmrc::detail::file_or_directory_*>_>,_bool>
  pVar3;
  allocator<char> local_e1;
  string local_e0;
  file_or_directory *local_c0;
  _Base_ptr local_b8;
  undefined1 local_b0;
  file_or_directory *local_a8;
  allocator<char> local_99;
  string local_98;
  _Base_ptr local_78;
  undefined1 local_70;
  file_or_directory *local_68;
  allocator<char> local_59;
  string local_58;
  directory *local_38;
  dir_inl root_directory_dir;
  file_or_directory *local_20 [3];
  
  if (get_root_index[abi:cxx11]()::root_directory_ == '\0') {
    iVar2 = __cxa_guard_acquire(&get_root_index[abi:cxx11]()::root_directory_);
    if (iVar2 != 0) {
      detail::directory::directory(&anon_unknown_1::get_root_index::root_directory_);
      __cxa_atexit(detail::directory::~directory,&anon_unknown_1::get_root_index::root_directory_,
                   &__dso_handle);
      __cxa_guard_release(&get_root_index[abi:cxx11]()::root_directory_);
    }
  }
  if (get_root_index[abi:cxx11]()::root_directory_fod == '\0') {
    iVar2 = __cxa_guard_acquire(&get_root_index[abi:cxx11]()::root_directory_fod);
    if (iVar2 != 0) {
      detail::file_or_directory::file_or_directory
                (&anon_unknown_1::get_root_index::root_directory_fod,
                 &anon_unknown_1::get_root_index::root_directory_);
      __cxa_guard_release(&get_root_index[abi:cxx11]()::root_directory_fod);
    }
  }
  if (get_root_index[abi:cxx11]()::root_index_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&get_root_index[abi:cxx11]()::root_index_abi_cxx11_);
    if (iVar2 != 0) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmrc::detail::file_or_directory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmrc::detail::file_or_directory_*>_>_>
      ::map(&get_root_index[abi:cxx11]()::root_index_abi_cxx11_);
      __cxa_atexit(std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmrc::detail::file_or_directory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmrc::detail::file_or_directory_*>_>_>
                   ::~map,&get_root_index[abi:cxx11]()::root_index_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&get_root_index[abi:cxx11]()::root_index_abi_cxx11_);
    }
  }
  local_20[0] = &anon_unknown_1::get_root_index::root_directory_fod;
  pVar3 = std::
          map<std::__cxx11::string,cmrc::detail::file_or_directory_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>>>
          ::emplace<char_const(&)[1],cmrc::detail::file_or_directory*>
                    ((map<std::__cxx11::string,cmrc::detail::file_or_directory_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>>>
                      *)&get_root_index[abi:cxx11]()::root_index_abi_cxx11_,(char (*) [1])0x10802e,
                     local_20);
  root_directory_dir.directory = (directory *)pVar3.first._M_node;
  local_38 = &anon_unknown_1::get_root_index::root_directory_;
  if (get_root_index[abi:cxx11]()::f_bd13_imaginary_prefix_dir == '\0') {
    iVar2 = __cxa_guard_acquire(&get_root_index[abi:cxx11]()::f_bd13_imaginary_prefix_dir);
    pdVar1 = local_38;
    if (iVar2 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"imaginary-prefix",&local_59);
      anon_unknown_1::get_root_index::f_bd13_imaginary_prefix_dir =
           detail::directory::add_subdir(pdVar1,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::allocator<char>::~allocator(&local_59);
      __cxa_guard_release(&get_root_index[abi:cxx11]()::f_bd13_imaginary_prefix_dir);
    }
  }
  local_68 = anon_unknown_1::get_root_index::f_bd13_imaginary_prefix_dir.index_entry;
  pVar3 = std::
          map<std::__cxx11::string,cmrc::detail::file_or_directory_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>>>
          ::emplace<char_const(&)[17],cmrc::detail::file_or_directory*>
                    ((map<std::__cxx11::string,cmrc::detail::file_or_directory_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>>>
                      *)&get_root_index[abi:cxx11]()::root_index_abi_cxx11_,
                     (char (*) [17])"imaginary-prefix",&local_68);
  local_78 = (_Base_ptr)pVar3.first._M_node;
  local_70 = pVar3.second;
  if (get_root_index[abi:cxx11]()::f_c78b_imaginary_prefix_subdir_b_dir == '\0') {
    iVar2 = __cxa_guard_acquire(&get_root_index[abi:cxx11]()::f_c78b_imaginary_prefix_subdir_b_dir);
    pdVar1 = anon_unknown_1::get_root_index::f_bd13_imaginary_prefix_dir.directory;
    if (iVar2 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"subdir_b",&local_99);
      anon_unknown_1::get_root_index::f_c78b_imaginary_prefix_subdir_b_dir =
           detail::directory::add_subdir(pdVar1,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
      __cxa_guard_release(&get_root_index[abi:cxx11]()::f_c78b_imaginary_prefix_subdir_b_dir);
    }
  }
  local_a8 = anon_unknown_1::get_root_index::f_c78b_imaginary_prefix_subdir_b_dir.index_entry;
  pVar3 = std::
          map<std::__cxx11::string,cmrc::detail::file_or_directory_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>>>
          ::emplace<char_const(&)[26],cmrc::detail::file_or_directory*>
                    ((map<std::__cxx11::string,cmrc::detail::file_or_directory_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>>>
                      *)&get_root_index[abi:cxx11]()::root_index_abi_cxx11_,
                     (char (*) [26])"imaginary-prefix/subdir_b",&local_a8);
  pdVar1 = anon_unknown_1::get_root_index::f_c78b_imaginary_prefix_subdir_b_dir.directory;
  local_b8 = (_Base_ptr)pVar3.first._M_node;
  local_b0 = pVar3.second;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"file_b.txt",&local_e1);
  local_c0 = detail::directory::add_file(pdVar1,&local_e0,"I am a file!","");
  std::
  map<std::__cxx11::string,cmrc::detail::file_or_directory_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>>>
  ::emplace<char_const(&)[37],cmrc::detail::file_or_directory*>
            ((map<std::__cxx11::string,cmrc::detail::file_or_directory_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmrc::detail::file_or_directory_const*>>>
              *)&get_root_index[abi:cxx11]()::root_index_abi_cxx11_,
             (char (*) [37])"imaginary-prefix/subdir_b/file_b.txt",&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  return &get_root_index[abi:cxx11]()::root_index_abi_cxx11_;
}

Assistant:

const cmrc::detail::index_type&
get_root_index() {
    static cmrc::detail::directory root_directory_;
    static cmrc::detail::file_or_directory root_directory_fod{root_directory_};
    static cmrc::detail::index_type root_index;
    root_index.emplace("", &root_directory_fod);
    struct dir_inl {
        class cmrc::detail::directory& directory;
    };
    dir_inl root_directory_dir{root_directory_};
    (void)root_directory_dir;
    static auto f_bd13_imaginary_prefix_dir = root_directory_dir.directory.add_subdir("imaginary-prefix");
    root_index.emplace("imaginary-prefix", &f_bd13_imaginary_prefix_dir.index_entry);
    static auto f_c78b_imaginary_prefix_subdir_b_dir = f_bd13_imaginary_prefix_dir.directory.add_subdir("subdir_b");
    root_index.emplace("imaginary-prefix/subdir_b", &f_c78b_imaginary_prefix_subdir_b_dir.index_entry);
    root_index.emplace(
        "imaginary-prefix/subdir_b/file_b.txt",
        f_c78b_imaginary_prefix_subdir_b_dir.directory.add_file(
            "file_b.txt",
            res_chars::f_a432_subdir_b_file_b_txt_begin,
            res_chars::f_a432_subdir_b_file_b_txt_end
        )
    );
    return root_index;
}